

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiPartFileMixingBasic.cpp
# Opt level: O3

bool anon_unknown.dwarf_1f7001::checkSampleCount
               (Array2D<unsigned_int> *sampleCount,int x1,int x2,int y1,int y2,int width)

{
  ostream *poVar1;
  long *plVar2;
  int iVar3;
  bool bVar4;
  uint *puVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  
  bVar4 = true;
  if (y1 <= y2) {
    iVar3 = y1 * width;
    puVar5 = sampleCount->_data + sampleCount->_sizeY * (long)y1;
    bVar4 = false;
    lVar8 = (long)y1;
    do {
      lVar7 = (long)x1;
      if (x1 <= x2) {
        do {
          uVar6 = (iVar3 + (int)lVar7) % 10 + 1;
          if (puVar5[lVar7] != uVar6) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"sample count at ",0x10);
            poVar1 = (ostream *)std::ostream::operator<<(&std::cout,(int)lVar7);
            std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
            poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)lVar8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar1,": ",2);
            poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar1,", should be ",0xc);
            plVar2 = (long *)std::ostream::operator<<(poVar1,uVar6);
            std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
            std::ostream::put((char)plVar2);
            std::ostream::flush();
            std::ostream::flush();
            return bVar4;
          }
          lVar7 = lVar7 + 1;
        } while (x2 + 1 != (int)lVar7);
      }
      lVar7 = lVar8 + 1;
      bVar4 = y2 <= lVar8;
      iVar3 = iVar3 + width;
      puVar5 = puVar5 + sampleCount->_sizeY;
      lVar8 = lVar7;
    } while (y2 + 1 != (int)lVar7);
  }
  return bVar4;
}

Assistant:

bool
checkSampleCount (
    Array2D<unsigned int>& sampleCount,
    int                    x1,
    int                    x2,
    int                    y1,
    int                    y2,
    int                    width)
{
    for (int i = y1; i <= y2; i++)
        for (int j = x1; j <= x2; j++)
        {
            if (sampleCount[i][j] !=
                static_cast<unsigned int> (((i * width) + j) % 10 + 1))
            {
                cout << "sample count at " << j << ", " << i << ": "
                     << sampleCount[i][j] << ", should be "
                     << (i * width + j) % 10 + 1 << endl
                     << flush;
                return false;
            }
        }
    return true;
}